

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spfgmr_serial.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint onoff;
  N_Vector v_vec;
  void *flagvalue;
  N_Vector z_vec;
  long lVar4;
  SUNLinearSolver S;
  char *__s;
  long lVar5;
  sunrealtype sVar6;
  int fails;
  double local_78;
  ulong local_70;
  SUNContext sunctx;
  UserData ProbData;
  
  fails = 0;
  iVar1 = SUNContext_Create(0,&sunctx);
  if (iVar1 == 0) {
    iVar1 = 1;
    if (argc < 6) {
      puts("ERROR: FIVE (5) Inputs required:");
      puts("  Problem size should be >0");
      puts("  Gram-Schmidt orthogonalization type should be 1 or 2");
      puts("  Maximum Krylov subspace dimension should be >0");
      puts("  Solver tolerance should be >0");
      __s = "  timing output flag should be 0 or 1 ";
    }
    else {
      problem_size = atol(argv[1]);
      ProbData.N = problem_size;
      if (problem_size < 1) {
        __s = "ERROR: Problem size must be a positive integer";
      }
      else {
        uVar2 = atoi(argv[2]);
        if (uVar2 - 3 < 0xfffffffe) {
          __s = "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2";
        }
        else {
          uVar3 = atoi(argv[3]);
          if ((int)uVar3 < 1) {
            __s = "ERROR: Maximum Krylov subspace dimension must be a positive integer";
          }
          else {
            local_78 = atof(argv[4]);
            if (0.0 < local_78) {
              onoff = atoi(argv[5]);
              SetTiming(onoff);
              puts("\nSPFGMR linear solver test:");
              printf("  problem size = %ld\n",ProbData.N);
              printf("  Gram-Schmidt orthogonalization type = %i\n",(ulong)uVar2);
              printf("  Maximum Krylov subspace dimension = %i\n",(ulong)uVar3);
              printf("  Solver Tolerance = %g\n",local_78);
              printf("  timing output flag = %i\n\n",(ulong)onoff);
              v_vec = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
              iVar1 = check_flag(v_vec,"N_VNew_Serial",0);
              if (iVar1 != 0) {
                return 1;
              }
              flagvalue = (void *)N_VNew_Serial(ProbData.N,sunctx);
              iVar1 = check_flag(flagvalue,"N_VNew_Serial",0);
              if (iVar1 != 0) {
                return 1;
              }
              z_vec = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
              iVar1 = check_flag(z_vec,"N_VNew_Serial",0);
              if (iVar1 != 0) {
                return 1;
              }
              ProbData.d = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
              iVar1 = check_flag(ProbData.d,"N_VNew_Serial",0);
              if (iVar1 != 0) {
                return 1;
              }
              ProbData.s1 = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
              iVar1 = check_flag(ProbData.s1,"N_VNew_Serial",0);
              if (iVar1 != 0) {
                return 1;
              }
              ProbData.s2 = (N_Vector)N_VNew_Serial(ProbData.N,sunctx);
              iVar1 = check_flag(ProbData.s2,"N_VNew_Serial",0);
              if (iVar1 != 0) {
                return 1;
              }
              lVar4 = N_VGetArrayPointer(flagvalue);
              for (lVar5 = 0; lVar5 < ProbData.N; lVar5 = lVar5 + 1) {
                sVar6 = urand();
                *(double *)(lVar4 + lVar5 * 8) = sVar6 + 1.0;
              }
              N_VConst(0x4014000000000000,ProbData.d);
              S = (SUNLinearSolver)SUNLinSol_SPFGMR(v_vec,2,uVar3);
              iVar1 = Test_SUNLinSolGetType(S,SUNLINEARSOLVER_ITERATIVE,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolGetID(S,SUNLINEARSOLVER_SPFGMR,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetATimes(S,&ProbData,ATimes,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetPreconditioner(S,&ProbData,PSetup,PSolve,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetScalingVectors(S,ProbData.s1,ProbData.s2,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetZeroGuess(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolInitialize(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSpace(S,0);
              fails = fails + iVar1;
              iVar1 = SUNLinSol_SPFGMRSetGSType(S,uVar2);
              fails = iVar1 + fails;
              if (fails != 0) {
                printf("FAIL: SUNLinSol_SPFGMR module failed %i initialization tests\n\n",
                       (ulong)(uint)fails);
                return 1;
              }
              puts("SUCCESS: SUNLinSol_SPFGMR module passed all initialization tests\n");
              N_VConst(0x3ff0000000000000,ProbData.s1);
              N_VConst(0x3ff0000000000000,ProbData.s2);
              N_VDiv(flagvalue,ProbData.s2,v_vec);
              fails = ATimes(&ProbData,v_vec,z_vec);
              iVar1 = check_flag(&fails,"ATimes",1);
              if (iVar1 != 0) {
                return 1;
              }
              local_70 = 0;
              iVar1 = SUNLinSol_SPFGMRSetPrecType(S);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,1,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolLastFlag(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolNumIters(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResNorm(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResid(S,0);
              fails = iVar1 + fails;
              if (fails == 0) {
                puts("SUCCESS: SUNLinSol_SPFGMR module, problem 1, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_SPFGMR module, problem 1, failed %i tests\n\n",
                       (ulong)(uint)fails);
                local_70 = 1;
              }
              N_VConst(0x3ff0000000000000,ProbData.s1);
              N_VConst(0x3ff0000000000000,ProbData.s2);
              N_VDiv(flagvalue,ProbData.s2,v_vec);
              fails = ATimes(&ProbData,v_vec,z_vec);
              iVar1 = check_flag(&fails,"ATimes",1);
              if (iVar1 != 0) {
                return 1;
              }
              iVar1 = SUNLinSol_SPFGMRSetPrecType(S);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,1,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolLastFlag(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolNumIters(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResNorm(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResid(S,0);
              fails = iVar1 + fails;
              if (fails == 0) {
                puts("SUCCESS: SUNLinSol_SPFGMR module, problem 2, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_SPFGMR module, problem 2, failed %i tests\n\n",
                       (ulong)(uint)fails);
                local_70 = (ulong)((int)local_70 + 1);
              }
              lVar4 = N_VGetArrayPointer(ProbData.s1);
              for (lVar5 = 0; lVar5 < ProbData.N; lVar5 = lVar5 + 1) {
                sVar6 = urand();
                *(double *)(lVar4 + lVar5 * 8) = sVar6 * 1000.0 + 1.0;
              }
              N_VConst(0x3ff0000000000000,ProbData.s2);
              N_VDiv(flagvalue,ProbData.s2,v_vec);
              fails = ATimes(&ProbData,v_vec,z_vec);
              iVar1 = check_flag(&fails,"ATimes",1);
              if (iVar1 != 0) {
                return 1;
              }
              iVar1 = SUNLinSol_SPFGMRSetPrecType(S);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,1,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolLastFlag(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolNumIters(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResNorm(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResid(S,0);
              fails = iVar1 + fails;
              if (fails == 0) {
                puts("SUCCESS: SUNLinSol_SPFGMR module, problem 3, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_SPFGMR module, problem 3, failed %i tests\n\n",
                       (ulong)(uint)fails);
                local_70 = (ulong)((int)local_70 + 1);
              }
              lVar4 = N_VGetArrayPointer(ProbData.s1);
              for (lVar5 = 0; lVar5 < ProbData.N; lVar5 = lVar5 + 1) {
                sVar6 = urand();
                *(double *)(lVar4 + lVar5 * 8) = sVar6 * 1000.0 + 1.0;
              }
              N_VConst(0x3ff0000000000000,ProbData.s2);
              N_VDiv(flagvalue,ProbData.s2,v_vec);
              fails = ATimes(&ProbData,v_vec,z_vec);
              iVar1 = check_flag(&fails,"ATimes",1);
              if (iVar1 != 0) {
                return 1;
              }
              iVar1 = SUNLinSol_SPFGMRSetPrecType(S);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,1,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolLastFlag(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolNumIters(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResNorm(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResid(S,0);
              fails = iVar1 + fails;
              if (fails == 0) {
                puts("SUCCESS: SUNLinSol_SPFGMR module, problem 4, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_SPFGMR module, problem 4, failed %i tests\n\n",
                       (ulong)(uint)fails);
                local_70 = (ulong)((int)local_70 + 1);
              }
              N_VConst(0x3ff0000000000000,ProbData.s1);
              lVar4 = N_VGetArrayPointer(ProbData.s2);
              for (lVar5 = 0; lVar5 < ProbData.N; lVar5 = lVar5 + 1) {
                sVar6 = urand();
                *(double *)(lVar4 + lVar5 * 8) = sVar6 * 1000.0 + 1.0;
              }
              N_VDiv(flagvalue,ProbData.s2,v_vec);
              fails = ATimes(&ProbData,v_vec,z_vec);
              iVar1 = check_flag(&fails,"ATimes",1);
              if (iVar1 != 0) {
                return 1;
              }
              iVar1 = SUNLinSol_SPFGMRSetPrecType(S);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,1,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolLastFlag(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolNumIters(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResNorm(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResid(S,0);
              fails = iVar1 + fails;
              if (fails == 0) {
                puts("SUCCESS: SUNLinSol_SPFGMR module, problem 5, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_SPFGMR module, problem 5, failed %i tests\n\n",
                       (ulong)(uint)fails);
                local_70 = (ulong)((int)local_70 + 1);
              }
              N_VConst(0x3ff0000000000000,ProbData.s1);
              lVar4 = N_VGetArrayPointer(ProbData.s2);
              for (lVar5 = 0; lVar5 < ProbData.N; lVar5 = lVar5 + 1) {
                sVar6 = urand();
                *(double *)(lVar4 + lVar5 * 8) = sVar6 * 1000.0 + 1.0;
              }
              N_VDiv(flagvalue,ProbData.s2,v_vec);
              fails = ATimes(&ProbData,v_vec,z_vec);
              iVar1 = check_flag(&fails,"ATimes",1);
              if (iVar1 != 0) {
                return 1;
              }
              iVar1 = SUNLinSol_SPFGMRSetPrecType(S);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSetup(S,(SUNMatrix)0x0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,1,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolSolve(S,(SUNMatrix)0x0,v_vec,z_vec,local_78,0,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolLastFlag(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolNumIters(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResNorm(S,0);
              fails = fails + iVar1;
              iVar1 = Test_SUNLinSolResid(S,0);
              fails = iVar1 + fails;
              if (fails == 0) {
                puts("SUCCESS: SUNLinSol_SPFGMR module, problem 6, passed all tests\n");
              }
              else {
                printf("FAIL: SUNLinSol_SPFGMR module, problem 6, failed %i tests\n\n",
                       (ulong)(uint)fails);
                local_70 = (ulong)((int)local_70 + 1);
              }
              SUNLinSolFree(S);
              N_VDestroy(v_vec);
              N_VDestroy(flagvalue);
              N_VDestroy(z_vec);
              N_VDestroy(ProbData.d);
              N_VDestroy(ProbData.s1);
              N_VDestroy(ProbData.s2);
              SUNContext_Free(&sunctx);
              return (int)local_70;
            }
            __s = "ERROR: Solver tolerance must be a positive real number";
          }
        }
      }
    }
    puts(__s);
  }
  else {
    puts("ERROR: SUNContext_Create failed");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails    = 0;    /* counter for test failures */
  int passfail = 0;    /* overall pass/fail flag    */
  SUNLinearSolver LS;  /* linear solver object      */
  N_Vector xhat, x, b; /* test vectors              */
  UserData ProbData;   /* problem data structure    */
  int gstype, maxl, print_timing;
  sunindextype i;
  sunrealtype* vecdata;
  double tol;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check inputs: local problem size, timing flag */
  if (argc < 6)
  {
    printf("ERROR: FIVE (5) Inputs required:\n");
    printf("  Problem size should be >0\n");
    printf("  Gram-Schmidt orthogonalization type should be 1 or 2\n");
    printf("  Maximum Krylov subspace dimension should be >0\n");
    printf("  Solver tolerance should be >0\n");
    printf("  timing output flag should be 0 or 1 \n");
    return 1;
  }
  ProbData.N   = (sunindextype)atol(argv[1]);
  problem_size = ProbData.N;
  if (ProbData.N <= 0)
  {
    printf("ERROR: Problem size must be a positive integer\n");
    return 1;
  }
  gstype = atoi(argv[2]);
  if ((gstype < 1) || (gstype > 2))
  {
    printf(
      "ERROR: Gram-Schmidt orthogonalization type must be either 1 or 2\n");
    return 1;
  }
  maxl = atoi(argv[3]);
  if (maxl <= 0)
  {
    printf(
      "ERROR: Maximum Krylov subspace dimension must be a positive integer\n");
    return 1;
  }
  tol = atof(argv[4]);
  if (tol <= ZERO)
  {
    printf("ERROR: Solver tolerance must be a positive real number\n");
    return 1;
  }
  print_timing = atoi(argv[5]);
  SetTiming(print_timing);

  printf("\nSPFGMR linear solver test:\n");
  printf("  problem size = %ld\n", (long int)ProbData.N);
  printf("  Gram-Schmidt orthogonalization type = %i\n", gstype);
  printf("  Maximum Krylov subspace dimension = %i\n", maxl);
  printf("  Solver Tolerance = %g\n", tol);
  printf("  timing output flag = %i\n\n", print_timing);

  /* Create vectors */
  x = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(x, "N_VNew_Serial", 0)) { return 1; }
  xhat = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(xhat, "N_VNew_Serial", 0)) { return 1; }
  b = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(b, "N_VNew_Serial", 0)) { return 1; }
  ProbData.d = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.d, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s1 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s1, "N_VNew_Serial", 0)) { return 1; }
  ProbData.s2 = N_VNew_Serial(ProbData.N, sunctx);
  if (check_flag(ProbData.s2, "N_VNew_Serial", 0)) { return 1; }

  /* Fill xhat vector with uniform random data in [1,2] */
  vecdata = N_VGetArrayPointer(xhat);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + urand(); }

  /* Fill Jacobi vector with matrix diagonal */
  N_VConst(FIVE, ProbData.d);

  /* Create SPFGMR linear solver */
  LS = SUNLinSol_SPFGMR(x, SUN_PREC_RIGHT, maxl, sunctx);
  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_ITERATIVE, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_SPFGMR, 0);
  fails += Test_SUNLinSolSetATimes(LS, &ProbData, ATimes, 0);
  fails += Test_SUNLinSolSetPreconditioner(LS, &ProbData, PSetup, PSolve, 0);
  fails += Test_SUNLinSolSetScalingVectors(LS, ProbData.s1, ProbData.s2, 0);
  fails += Test_SUNLinSolSetZeroGuess(LS, 0);
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);
  fails += SUNLinSol_SPFGMRSetGSType(LS, gstype);
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module failed %i initialization tests\n\n",
           fails);
    return 1;
  }
  else
  {
    printf(
      "SUCCESS: SUNLinSol_SPFGMR module passed all initialization tests\n\n");
  }

  /*** Test 1: simple Poisson-like solve (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 1, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 1, passed all tests\n\n");
  }

  /*** Test 2: simple Poisson-like solve (Jacobi preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 2, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 2, passed all tests\n\n");
  }

  /*** Test 3: Poisson-like solve w/ scaled rows (no preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 3, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 3, passed all tests\n\n");
  }

  /*** Test 4: Poisson-like solve w/ scaled rows (Jacobi preconditioning) ***/

  /* set scaling vectors */
  vecdata = N_VGetArrayPointer(ProbData.s1);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }
  N_VConst(ONE, ProbData.s2);

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 4, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 4, passed all tests\n\n");
  }

  /*** Test 5: Poisson-like solve w/ scaled columns (no preconditioning) ***/

  /* set scaling vectors */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_NONE);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 5, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 5, passed all tests\n\n");
  }

  /*** Test 6: Poisson-like solve w/ scaled columns (Jacobi preconditioning) ***/

  /* set scaling vector, Jacobi solver vector */
  N_VConst(ONE, ProbData.s1);
  vecdata = N_VGetArrayPointer(ProbData.s2);
  for (i = 0; i < ProbData.N; i++) { vecdata[i] = ONE + THOUSAND * urand(); }

  /* Fill x vector with scaled version */
  N_VDiv(xhat, ProbData.s2, x);

  /* Fill b vector with result of matrix-vector product */
  fails = ATimes(&ProbData, x, b);
  if (check_flag(&fails, "ATimes", 1)) { return 1; }

  /* Run tests with this setup */
  fails += SUNLinSol_SPFGMRSetPrecType(LS, SUN_PREC_RIGHT);
  fails += Test_SUNLinSolSetup(LS, NULL, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNTRUE, 0);
  fails += Test_SUNLinSolSolve(LS, NULL, x, b, tol, SUNFALSE, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolNumIters(LS, 0);
  fails += Test_SUNLinSolResNorm(LS, 0);
  fails += Test_SUNLinSolResid(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol_SPFGMR module, problem 6, failed %i tests\n\n",
           fails);
    passfail += 1;
  }
  else
  {
    printf("SUCCESS: SUNLinSol_SPFGMR module, problem 6, passed all tests\n\n");
  }

  /* Free solver and vectors */
  SUNLinSolFree(LS);
  N_VDestroy(x);
  N_VDestroy(xhat);
  N_VDestroy(b);
  N_VDestroy(ProbData.d);
  N_VDestroy(ProbData.s1);
  N_VDestroy(ProbData.s2);
  SUNContext_Free(&sunctx);

  return (passfail);
}